

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O3

void __thiscall QtMWidgets::TableViewCell::paintEvent(TableViewCell *this,QPaintEvent *e)

{
  TableViewCellPrivate *pTVar1;
  long lVar2;
  QPainter p;
  undefined1 auStack_28 [8];
  undefined8 local_20;
  undefined8 local_18;
  
  QWidget::paintEvent((QPaintEvent *)this);
  pTVar1 = (this->d).d;
  if ((pTVar1->clicked == true) && (pTVar1->highlightOnClick == true)) {
    QPainter::QPainter((QPainter *)auStack_28,(QPaintDevice *)&this->field_0x10);
    QPainter::setPen((QColor *)auStack_28);
    QBrush::QBrush((QBrush *)&local_20,&((this->d).d)->highlightColor,SolidPattern);
    QPainter::setBrush((QBrush *)auStack_28);
    QBrush::~QBrush((QBrush *)&local_20);
    lVar2 = *(long *)&this->field_0x20;
    local_18 = CONCAT44(~*(uint *)(lVar2 + 0x18) + *(int *)(lVar2 + 0x20),
                        ~*(uint *)(lVar2 + 0x14) + *(int *)(lVar2 + 0x1c));
    local_20._0_4_ = 0;
    local_20._4_4_ = 0;
    QPainter::drawRects((QRect *)auStack_28,(int)&local_20);
    QPainter::~QPainter((QPainter *)auStack_28);
  }
  return;
}

Assistant:

void
TableViewCell::paintEvent( QPaintEvent * e )
{
	QWidget::paintEvent( e );

	if( d->clicked && d->highlightOnClick )
	{
		QPainter p( this );

		p.setPen( d->highlightColor );
		p.setBrush( d->highlightColor );

		p.drawRect( rect().adjusted( 0, 0, -1, -1 ) );
	}
}